

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O3

int __thiscall cmCPackArchiveGenerator::PackageComponentsAllInOne(cmCPackArchiveGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer pcVar3;
  cmCPackLog *pcVar4;
  pointer pbVar5;
  long *msg;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  ostream *poVar10;
  _Base_ptr p_Var11;
  cmGeneratedFileStream gf;
  ostringstream cmCPackLog_msg_1;
  cmArchiveWrite archive;
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  undefined1 local_4c8 [112];
  ios_base local_458 [472];
  undefined1 local_280 [16];
  _func_int *local_270 [12];
  ios_base local_210 [264];
  undefined1 local_108 [64];
  _Alloc_hider local_c8;
  size_type local_c0;
  
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_00,(this->super_cmCPackGenerator).packageFileNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  pcVar2 = local_4c8 + 0x10;
  pcVar3 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
  local_4c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4c8,pcVar3,
             pcVar3 + (this->super_cmCPackGenerator).toplevel._M_string_length);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8);
  if ((pointer)local_4c8._0_8_ != pcVar2) {
    operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
  }
  std::__cxx11::string::append
            ((char *)(this_00->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  local_4c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"CPACK_ARCHIVE_FILE_NAME","");
  bVar7 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_4c8);
  if ((pointer)local_4c8._0_8_ != pcVar2) {
    operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
  }
  if (bVar7) {
    local_4c8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4c8,"CPACK_ARCHIVE_FILE_NAME","");
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_4c8);
    std::__cxx11::string::append
              ((char *)(this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    local_4c8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4c8,"CPACK_PACKAGE_FILE_NAME","");
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_4c8);
    std::__cxx11::string::append
              ((char *)(this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_4c8._0_8_ != pcVar2) {
    operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
  }
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  std::__cxx11::string::append
            ((char *)(this->super_cmCPackGenerator).packageFileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4c8,
             "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
             ,0x59);
  std::ios::widen((char)(ostringstream *)local_4c8 + (char)*(undefined8 *)(local_4c8._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_4c8);
  std::ostream::flush();
  pcVar4 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  uVar6 = local_280._0_8_;
  sVar9 = strlen((char *)local_280._0_8_);
  cmCPackLog::Log(pcVar4,2,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0xd8,(char *)uVar6,sVar9);
  if ((_func_int **)local_280._0_8_ != local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
  std::ios_base::~ios_base(local_458);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_4c8,None);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)local_4c8,
             (((this_00->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,false,true);
  iVar8 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1b])(this,local_4c8);
  if (iVar8 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,"Problem to generate Header for archive < ",0x29);
    pbVar5 = (this_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,">.",2);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    pcVar4 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar6 = local_108._0_8_;
    sVar9 = strlen((char *)local_108._0_8_);
    cmCPackLog::Log(pcVar4,0x10,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xd9,(char *)uVar6,sVar9);
    if ((ostream *)local_108._0_8_ != (ostream *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,(ulong)((long)(uint *)local_108._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
    std::ios_base::~ios_base(local_210);
    iVar8 = 0;
  }
  else {
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)local_108,(ostream *)local_4c8,this->Compress,&this->ArchiveFormat)
    ;
    if (local_c0 == 0) {
      p_Var11 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      iVar8 = 1;
      if ((_Rb_tree_header *)p_Var11 != p_Var1) {
        do {
          addOneComponentToArchive
                    (this,(cmArchiveWrite *)local_108,(cmCPackComponent *)(p_Var11 + 2));
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_280,"Problem to create archive < ",0x1c);
      pbVar5 = (this_00->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,">. ERROR =",10);
      local_4e8 = local_4d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e8,local_c8._M_p,local_c8._M_p + local_c0);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_4e8,local_4e0);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if (local_4e8 != local_4d8) {
        operator_delete(local_4e8,local_4d8[0] + 1);
      }
      pcVar4 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      msg = local_4e8;
      sVar9 = strlen((char *)local_4e8);
      cmCPackLog::Log(pcVar4,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0xd9,(char *)msg,sVar9);
      if (local_4e8 != local_4d8) {
        operator_delete(local_4e8,local_4d8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
      std::ios_base::~ios_base(local_210);
      iVar8 = 0;
    }
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_108);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c8);
  return iVar8;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponentsAllInOne()
{
  // reset the package file names
  packageFileNames.clear();
  packageFileNames.push_back(std::string(toplevel));
  packageFileNames[0] += "/";

  if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    packageFileNames[0] += this->GetOption("CPACK_ARCHIVE_FILE_NAME");
  } else {
    packageFileNames[0] += this->GetOption("CPACK_PACKAGE_FILE_NAME");
  }

  packageFileNames[0] += this->GetOutputExtension();

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                  << std::endl);
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0], archive);

  // The ALL COMPONENTS in ONE package case
  std::map<std::string, cmCPackComponent>::iterator compIt;
  for (compIt = this->Components.begin(); compIt != this->Components.end();
       ++compIt) {
    // Add the files of this component to the archive
    addOneComponentToArchive(archive, &(compIt->second));
  }

  // archive goes out of scope so it will finalized and closed.
  return 1;
}